

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_path.cpp
# Opt level: O1

void duckdb::ParseDirpathFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  Vector *pVVar1;
  ulong *puVar2;
  value_type vVar3;
  anon_union_16_2_67f50693_for_value *paVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar6;
  long *plVar7;
  undefined8 uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  reference vector;
  UnifiedVectorFormat *pUVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  ulong uVar12;
  UnifiedVectorFormat *pUVar13;
  long lVar14;
  long lVar15;
  VectorType VVar16;
  ValidityMask *in_R9;
  idx_t idx_in_entry;
  UnifiedVectorFormat *pUVar17;
  ulong uVar18;
  ulong uVar19;
  undefined8 *puVar20;
  ulong uVar21;
  anon_struct_16_3_d7536bce_for_pointer aVar22;
  string_t sVar23;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t left_06;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  UnifiedVectorFormat ldata;
  Vector separator;
  Vector trim_extension;
  idx_t in_stack_fffffffffffffe18;
  UnifiedVectorFormat *local_1e0;
  undefined8 local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1a0;
  unsigned_long local_198;
  Value local_190;
  undefined7 uStack_18f;
  long local_188;
  long local_180;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  Vector local_148 [8];
  LogicalType local_140 [24];
  anon_union_16_2_67f50693_for_value *local_128;
  byte *local_120;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> local_118;
  undefined8 local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  Value local_98 [8];
  LogicalType local_90 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  sVar23.value.pointer.ptr = (char *)0x746c75;
  sVar23.value._0_8_ = 0x6166656400000007;
  duckdb::Value::Value(local_98,sVar23);
  duckdb::Vector::Vector(local_148,local_98);
  duckdb::Value::~Value(local_98);
  duckdb::Value::Value(&local_190,0);
  duckdb::Vector::Vector((Vector *)local_98,&local_190);
  duckdb::Value::~Value(&local_190);
  local_190 = (Value)0x1;
  ReadOptionalArgs(args,local_148,(Vector *)local_98,(bool *)&local_190);
  vVar3 = *vector;
  VVar16 = (VectorType)result;
  if (((byte)vVar3 ^ 2) == 0 && ((byte)local_148[0] ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar16);
    paVar4 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((local_120 == (byte *)0x0 || ((*local_120 & 1) != 0)))) {
      aVar22 = (anon_struct_16_3_d7536bce_for_pointer)
               BinaryLambdaWrapper::
               Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)
                          (*(anon_union_16_2_67f50693_for_value **)(vector + 0x20))->pointer,
                          (string_t)local_128->pointer,in_R9,in_stack_fffffffffffffe18);
      paVar4->pointer = aVar22;
      goto LAB_00732011;
    }
  }
  else {
    local_1e0 = *(UnifiedVectorFormat **)(args + 0x18);
    if (((byte)local_148[0] ^ 2) == 0 && vVar3 == (value_type)0x0) {
      lVar5 = *(long *)(vector + 0x20);
      if ((local_120 == (byte *)0x0) || ((*local_120 & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar16);
        lVar15 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (local_1e0 != (UnifiedVectorFormat *)0x0) {
            aVar22 = local_128->pointer;
            lVar14 = 8;
            do {
              left_02.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + lVar14);
              left_02.value._0_8_ = *(undefined8 *)(lVar5 + -8 + lVar14);
              sVar23 = BinaryLambdaWrapper::
                       Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,left_02,(string_t)aVar22,in_R9,
                                  in_stack_fffffffffffffe18);
              *(long *)(lVar15 + -8 + lVar14) = sVar23.value._0_8_;
              *(long *)(lVar15 + lVar14) = sVar23.value._8_8_;
              lVar14 = lVar14 + 0x10;
              local_1e0 = local_1e0 + -1;
            } while (local_1e0 != (UnifiedVectorFormat *)0x0);
          }
        }
        else if ((UnifiedVectorFormat *)0x3f < local_1e0 + 0x3f) {
          uVar12 = 0;
          pUVar17 = (UnifiedVectorFormat *)0x0;
          do {
            if (*(long *)(result + 0x28) == 0) {
              uVar18 = 0xffffffffffffffff;
            }
            else {
              uVar18 = *(ulong *)(*(long *)(result + 0x28) + uVar12 * 8);
            }
            pUVar10 = pUVar17 + 0x40;
            if (local_1e0 <= pUVar17 + 0x40) {
              pUVar10 = local_1e0;
            }
            pUVar13 = pUVar10;
            if (uVar18 != 0) {
              pUVar13 = pUVar17;
              if (uVar18 == 0xffffffffffffffff) {
                if (pUVar17 < pUVar10) {
                  aVar22 = local_128->pointer;
                  uVar18 = (long)pUVar17 << 4 | 8;
                  do {
                    left.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + uVar18);
                    left.value._0_8_ = *(undefined8 *)(lVar5 + -8 + uVar18);
                    sVar23 = BinaryLambdaWrapper::
                             Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,left,(string_t)aVar22,in_R9,
                                        in_stack_fffffffffffffe18);
                    *(long *)(lVar15 + -8 + uVar18) = sVar23.value._0_8_;
                    *(long *)(lVar15 + uVar18) = sVar23.value._8_8_;
                    pUVar13 = pUVar13 + 1;
                    uVar18 = uVar18 + 0x10;
                  } while (pUVar10 != pUVar13);
                }
              }
              else if (pUVar17 < pUVar10) {
                uVar21 = (long)pUVar17 << 4 | 8;
                uVar19 = 0;
                do {
                  if ((uVar18 >> (uVar19 & 0x3f) & 1) != 0) {
                    left_00.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + uVar21);
                    left_00.value._0_8_ = *(undefined8 *)(lVar5 + -8 + uVar21);
                    sVar23 = BinaryLambdaWrapper::
                             Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,left_00,
                                        (string_t)local_128->pointer,in_R9,in_stack_fffffffffffffe18
                                       );
                    *(long *)(lVar15 + -8 + uVar21) = sVar23.value._0_8_;
                    *(long *)(lVar15 + uVar21) = sVar23.value._8_8_;
                  }
                  uVar19 = uVar19 + 1;
                  uVar21 = uVar21 + 0x10;
                } while (pUVar17 + (uVar19 - (long)pUVar10) != (UnifiedVectorFormat *)0x0);
                pUVar13 = pUVar17 + uVar19;
              }
            }
            uVar12 = uVar12 + 1;
            pUVar17 = pUVar13;
          } while (uVar12 != (ulong)(local_1e0 + 0x3f) >> 6);
        }
        goto LAB_00732011;
      }
    }
    else {
      if (((byte)vVar3 ^ 2) != 0 || local_148[0] != (Vector)0x0) {
        if (local_148[0] == (Vector)0x0 && vVar3 == (value_type)0x0) {
          lVar5 = *(long *)(vector + 0x20);
          duckdb::Vector::SetVectorType(VVar16);
          lVar15 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (result + 0x30),
                     (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (vector + 0x30));
          *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
          FlatVector::VerifyFlatVector(local_148);
          pVVar1 = result + 0x28;
          duckdb::ValidityMask::Combine((ValidityMask *)pVVar1,(ulong)&local_120);
          if (*(long *)pVVar1 == 0) {
            if (local_1e0 != (UnifiedVectorFormat *)0x0) {
              lVar14 = 8;
              do {
                left_06.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + lVar14);
                left_06.value._0_8_ = *(undefined8 *)(lVar5 + -8 + lVar14);
                right_06.value.pointer.ptr = (char *)*(undefined8 *)((long)local_128 + lVar14);
                right_06.value._0_8_ = *(undefined8 *)((long)local_128 + lVar14 + -8);
                sVar23 = BinaryLambdaWrapper::
                         Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_06,right_06,in_R9,
                                    in_stack_fffffffffffffe18);
                *(long *)(lVar15 + -8 + lVar14) = sVar23.value._0_8_;
                *(long *)(lVar15 + lVar14) = sVar23.value._8_8_;
                lVar14 = lVar14 + 0x10;
                local_1e0 = local_1e0 + -1;
              } while (local_1e0 != (UnifiedVectorFormat *)0x0);
            }
          }
          else if ((UnifiedVectorFormat *)0x3f < local_1e0 + 0x3f) {
            uVar12 = 0;
            pUVar17 = (UnifiedVectorFormat *)0x0;
            do {
              if (*(long *)pVVar1 == 0) {
                uVar18 = 0xffffffffffffffff;
              }
              else {
                uVar18 = *(ulong *)(*(long *)pVVar1 + uVar12 * 8);
              }
              pUVar10 = pUVar17 + 0x40;
              if (local_1e0 <= pUVar17 + 0x40) {
                pUVar10 = local_1e0;
              }
              pUVar13 = pUVar10;
              if (uVar18 != 0) {
                pUVar13 = pUVar17;
                if (uVar18 == 0xffffffffffffffff) {
                  if (pUVar17 < pUVar10) {
                    uVar18 = (long)pUVar17 << 4 | 8;
                    do {
                      left_03.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + uVar18);
                      left_03.value._0_8_ = *(undefined8 *)(lVar5 + -8 + uVar18);
                      right_02.value.pointer.ptr = (char *)*(undefined8 *)((long)local_128 + uVar18)
                      ;
                      right_02.value._0_8_ = *(undefined8 *)((long)local_128 + (uVar18 - 8));
                      sVar23 = BinaryLambdaWrapper::
                               Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                         ((anon_class_8_1_6971b95b)result,left_03,right_02,in_R9,
                                          in_stack_fffffffffffffe18);
                      *(long *)(lVar15 + -8 + uVar18) = sVar23.value._0_8_;
                      *(long *)(lVar15 + uVar18) = sVar23.value._8_8_;
                      pUVar17 = pUVar17 + 1;
                      uVar18 = uVar18 + 0x10;
                      pUVar13 = pUVar17;
                    } while (pUVar10 != pUVar17);
                  }
                }
                else if (pUVar17 < pUVar10) {
                  uVar21 = (long)pUVar17 << 4 | 8;
                  uVar19 = 0;
                  do {
                    if ((uVar18 >> (uVar19 & 0x3f) & 1) != 0) {
                      left_04.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + uVar21);
                      left_04.value._0_8_ = *(undefined8 *)(lVar5 + -8 + uVar21);
                      right_03.value.pointer.ptr = (char *)*(undefined8 *)((long)local_128 + uVar21)
                      ;
                      right_03.value._0_8_ = *(undefined8 *)((long)local_128 + (uVar21 - 8));
                      sVar23 = BinaryLambdaWrapper::
                               Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                         ((anon_class_8_1_6971b95b)result,left_04,right_03,in_R9,
                                          in_stack_fffffffffffffe18);
                      *(long *)(lVar15 + -8 + uVar21) = sVar23.value._0_8_;
                      *(long *)(lVar15 + uVar21) = sVar23.value._8_8_;
                    }
                    uVar19 = uVar19 + 1;
                    uVar21 = uVar21 + 0x10;
                  } while (pUVar17 + (uVar19 - (long)pUVar10) != (UnifiedVectorFormat *)0x0);
                  pUVar13 = pUVar17 + uVar19;
                }
              }
              uVar12 = uVar12 + 1;
              pUVar17 = pUVar13;
            } while (uVar12 != (ulong)(local_1e0 + 0x3f) >> 6);
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_190);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_e0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,local_1e0);
          duckdb::Vector::ToUnifiedFormat((ulong)local_148,local_1e0);
          duckdb::Vector::SetVectorType(VVar16);
          lVar5 = *(long *)(result + 0x20);
          plVar7 = (long *)CONCAT71(uStack_18f,local_190);
          FlatVector::VerifyFlatVector(result);
          if (local_d0 == 0 && local_180 == 0) {
            if (local_1e0 != (UnifiedVectorFormat *)0x0) {
              lVar15 = *plVar7;
              lVar14 = *local_e0;
              puVar20 = (undefined8 *)(lVar5 + 8);
              pUVar17 = (UnifiedVectorFormat *)0x0;
              do {
                pUVar10 = pUVar17;
                if (lVar15 != 0) {
                  pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar15 + (long)pUVar17 * 4);
                }
                pUVar13 = pUVar17;
                if (lVar14 != 0) {
                  pUVar13 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar14 + (long)pUVar17 * 4);
                }
                left_01.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_188 + 8 + (long)pUVar10 * 0x10);
                left_01.value._0_8_ = *(undefined8 *)(local_188 + (long)pUVar10 * 0x10);
                right.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_d8 + 8 + (long)pUVar13 * 0x10);
                right.value._0_8_ = *(undefined8 *)(local_d8 + (long)pUVar13 * 0x10);
                sVar23 = BinaryLambdaWrapper::
                         Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_01,right,in_R9,
                                    in_stack_fffffffffffffe18);
                puVar20[-1] = sVar23.value._0_8_;
                *puVar20 = sVar23.value._8_8_;
                pUVar17 = pUVar17 + 1;
                puVar20 = puVar20 + 2;
              } while (local_1e0 != pUVar17);
            }
          }
          else if (local_1e0 != (UnifiedVectorFormat *)0x0) {
            lVar15 = *plVar7;
            lVar14 = *local_e0;
            puVar20 = (undefined8 *)(lVar5 + 8);
            pUVar17 = (UnifiedVectorFormat *)0x0;
            do {
              pUVar10 = pUVar17;
              if (lVar15 != 0) {
                pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar15 + (long)pUVar17 * 4);
              }
              pUVar13 = pUVar17;
              if (lVar14 != 0) {
                pUVar13 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar14 + (long)pUVar17 * 4);
              }
              if (((local_180 == 0) ||
                  ((*(ulong *)(local_180 + ((ulong)pUVar10 >> 6) * 8) >> ((ulong)pUVar10 & 0x3f) & 1
                   ) != 0)) &&
                 ((local_d0 == 0 ||
                  ((*(ulong *)(local_d0 + ((ulong)pUVar13 >> 6) * 8) >> ((ulong)pUVar13 & 0x3f) & 1)
                   != 0)))) {
                left_05.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_188 + 8 + (long)pUVar10 * 0x10);
                left_05.value._0_8_ = *(undefined8 *)(local_188 + (long)pUVar10 * 0x10);
                right_04.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_d8 + 8 + (long)pUVar13 * 0x10);
                right_04.value._0_8_ = *(undefined8 *)(local_d8 + (long)pUVar13 * 0x10);
                sVar23 = BinaryLambdaWrapper::
                         Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_05,right_04,in_R9,
                                    in_stack_fffffffffffffe18);
                puVar20[-1] = sVar23.value._0_8_;
                *puVar20 = sVar23.value._8_8_;
              }
              else {
                if (*(long *)(result + 0x28) == 0) {
                  local_198 = *(unsigned_long *)(result + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_1a8,&local_198);
                  p_Var9 = p_Stack_1a0;
                  uVar8 = local_1a8;
                  local_1a8 = 0;
                  p_Stack_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
                  *(undefined8 *)(result + 0x30) = uVar8;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var9;
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  }
                  if (p_Stack_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1a0);
                  }
                  pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)(result + 0x30));
                  *(unsigned_long **)(result + 0x28) =
                       (pTVar11->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                }
                bVar6 = (byte)pUVar17 & 0x3f;
                puVar2 = (ulong *)(*(long *)(result + 0x28) + ((ulong)pUVar17 >> 6) * 8);
                *puVar2 = *puVar2 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
              }
              pUVar17 = pUVar17 + 1;
              puVar20 = puVar20 + 2;
            } while (local_1e0 != pUVar17);
          }
          if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
          }
          if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
          }
          if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
          }
          if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170);
          }
        }
        goto LAB_00732011;
      }
      paVar4 = *(anon_union_16_2_67f50693_for_value **)(vector + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar16);
        lVar5 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(local_148);
        FlatVector::VerifyFlatVector(result);
        *(byte **)(result + 0x28) = local_120;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,&local_118);
        *(undefined8 *)(result + 0x40) = local_108;
        if (*(long *)(result + 0x28) == 0) {
          if (local_1e0 != (UnifiedVectorFormat *)0x0) {
            aVar22 = paVar4->pointer;
            lVar15 = 8;
            do {
              right_05.value.pointer.ptr = (char *)*(undefined8 *)((long)local_128 + lVar15);
              right_05.value._0_8_ = *(undefined8 *)((long)local_128 + lVar15 + -8);
              sVar23 = BinaryLambdaWrapper::
                       Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,(string_t)aVar22,right_05,in_R9,
                                  in_stack_fffffffffffffe18);
              *(long *)(lVar5 + -8 + lVar15) = sVar23.value._0_8_;
              *(long *)(lVar5 + lVar15) = sVar23.value._8_8_;
              lVar15 = lVar15 + 0x10;
              local_1e0 = local_1e0 + -1;
            } while (local_1e0 != (UnifiedVectorFormat *)0x0);
          }
        }
        else if ((UnifiedVectorFormat *)0x3f < local_1e0 + 0x3f) {
          uVar12 = 0;
          pUVar17 = (UnifiedVectorFormat *)0x0;
          do {
            if (*(long *)(result + 0x28) == 0) {
              uVar18 = 0xffffffffffffffff;
            }
            else {
              uVar18 = *(ulong *)(*(long *)(result + 0x28) + uVar12 * 8);
            }
            pUVar10 = pUVar17 + 0x40;
            if (local_1e0 <= pUVar17 + 0x40) {
              pUVar10 = local_1e0;
            }
            pUVar13 = pUVar10;
            if (uVar18 != 0) {
              pUVar13 = pUVar17;
              if (uVar18 == 0xffffffffffffffff) {
                if (pUVar17 < pUVar10) {
                  aVar22 = paVar4->pointer;
                  uVar18 = (long)pUVar17 << 4 | 8;
                  do {
                    right_00.value.pointer.ptr = (char *)*(undefined8 *)((long)local_128 + uVar18);
                    right_00.value._0_8_ = *(undefined8 *)((long)local_128 + (uVar18 - 8));
                    sVar23 = BinaryLambdaWrapper::
                             Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,(string_t)aVar22,right_00,
                                        in_R9,in_stack_fffffffffffffe18);
                    *(long *)(lVar5 + -8 + uVar18) = sVar23.value._0_8_;
                    *(long *)(lVar5 + uVar18) = sVar23.value._8_8_;
                    pUVar13 = pUVar13 + 1;
                    uVar18 = uVar18 + 0x10;
                  } while (pUVar10 != pUVar13);
                }
              }
              else if (pUVar17 < pUVar10) {
                uVar21 = (long)pUVar17 << 4 | 8;
                uVar19 = 0;
                do {
                  if ((uVar18 >> (uVar19 & 0x3f) & 1) != 0) {
                    right_01.value.pointer.ptr = (char *)*(undefined8 *)((long)local_128 + uVar21);
                    right_01.value._0_8_ = *(undefined8 *)((long)local_128 + (uVar21 - 8));
                    sVar23 = BinaryLambdaWrapper::
                             Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,(string_t)paVar4->pointer,
                                        right_01,in_R9,in_stack_fffffffffffffe18);
                    *(long *)(lVar5 + -8 + uVar21) = sVar23.value._0_8_;
                    *(long *)(lVar5 + uVar21) = sVar23.value._8_8_;
                  }
                  uVar19 = uVar19 + 1;
                  uVar21 = uVar21 + 0x10;
                } while (pUVar17 + (uVar19 - (long)pUVar10) != (UnifiedVectorFormat *)0x0);
                pUVar13 = pUVar17 + uVar19;
              }
            }
            uVar12 = uVar12 + 1;
            pUVar17 = pUVar13;
          } while (uVar12 != (ulong)(local_1e0 + 0x3f) >> 6);
        }
        goto LAB_00732011;
      }
    }
    duckdb::Vector::SetVectorType(VVar16);
  }
  duckdb::ConstantVector::SetNull(result,true);
LAB_00732011:
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  duckdb::LogicalType::~LogicalType(local_90);
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
  }
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  if (local_118.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  duckdb::LogicalType::~LogicalType(local_140);
  return;
}

Assistant:

static void ParseDirpathFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	// set default values
	Vector &path = args.data[0];
	Vector separator(string_t("default"));
	Vector trim_extension(false);
	ReadOptionalArgs(args, separator, trim_extension, true);

	BinaryExecutor::Execute<string_t, string_t, string_t>(
	    path, separator, result, args.size(), [&](string_t input_path, string_t input_sep) {
		    auto path = input_path.GetData();
		    auto path_size = input_path.GetSize();
		    auto sep = GetSeparator(input_sep.GetString());

		    auto last_sep = FindLast(path, path_size, sep);
		    if (last_sep == 0 && path_size == 1) {
			    last_sep = 1;
		    }
		    idx_t new_size = (IsIdxValid(last_sep, path_size)) ? last_sep : 0;

		    auto target = StringVector::EmptyString(result, new_size);
		    auto output = target.GetDataWriteable();
		    memcpy(output, path, new_size);
		    target.Finalize();
		    return StringVector::AddString(result, target);
	    });
}